

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_op.hpp
# Opt level: O2

want __thiscall
asio::ssl::detail::read_op<asio::mutable_buffers_1>::operator()
          (read_op<asio::mutable_buffers_1> *this,engine *eng,error_code *ec,
          size_t *bytes_transferred)

{
  ssize_t sVar1;
  mutable_buffer buffer;
  void *local_10;
  size_t sStack_8;
  
  local_10 = (this->buffers_).super_mutable_buffer.data_;
  sStack_8 = (this->buffers_).super_mutable_buffer.size_;
  sVar1 = engine::read(eng,(int)&local_10,ec,(size_t)bytes_transferred);
  return (want)sVar1;
}

Assistant:

engine::want operator()(engine& eng,
      asio::error_code& ec,
      std::size_t& bytes_transferred) const
  {
    asio::mutable_buffer buffer =
      asio::detail::buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence>::first(buffers_);

    return eng.read(buffer, ec, bytes_transferred);
  }